

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O0

double sqrt(double __x)

{
  double *in_RDI;
  double dVar1;
  HighsCDouble HVar2;
  double c;
  HighsCDouble res;
  HighsCDouble *in_stack_ffffffffffffffd8;
  double in_stack_fffffffffffffff0;
  
  dVar1 = sqrt(*in_RDI + in_RDI[1]);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    HVar2 = HighsCDouble::operator/(in_stack_ffffffffffffffd8,3.21068708169628e-317);
    HighsCDouble::operator+=((HighsCDouble *)HVar2.hi,(double)in_RDI);
    in_stack_fffffffffffffff0 = HVar2.hi * 0.5;
  }
  else {
    HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xfffffffffffffff0,0.0);
  }
  return in_stack_fffffffffffffff0;
}

Assistant:

HighsCDouble sqrt(const HighsCDouble& v) {
    double c = std::sqrt(v.hi + v.lo);

    // guard against division by zero
    if (c == 0.0) return 0.0;

    // calculate precise square root by newton step
    HighsCDouble res = v / c;
    res += c;
    // multiplication by 0.5 is exact
    res.hi *= 0.5;
    res.lo *= 0.5;
    return res;
  }